

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderCodeVariableDescX::ShaderCodeVariableDescX
          (ShaderCodeVariableDescX *this,ShaderCodeVariableDescX *Other)

{
  char *pcVar1;
  ShaderCodeVariableDescX *pSVar2;
  ShaderCodeVariableDescX *Other_local;
  ShaderCodeVariableDescX *this_local;
  
  memcpy(this,Other,0x28);
  std::__cxx11::string::string((string *)&this->NameCopy,(string *)&Other->NameCopy);
  std::__cxx11::string::string((string *)&this->TypeNameCopy,(string *)&Other->TypeNameCopy);
  std::vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
  ::vector(&this->Members,&Other->Members);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  (this->super_ShaderCodeVariableDesc).Name = pcVar1;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  (this->super_ShaderCodeVariableDesc).TypeName = pcVar1;
  pSVar2 = std::
           vector<Diligent::ShaderCodeVariableDescX,_std::allocator<Diligent::ShaderCodeVariableDescX>_>
           ::data(&this->Members);
  (this->super_ShaderCodeVariableDesc).pMembers = &pSVar2->super_ShaderCodeVariableDesc;
  return;
}

Assistant:

ShaderCodeVariableDescX(ShaderCodeVariableDescX&& Other) noexcept :
        ShaderCodeVariableDesc{Other},
        // clang-format off
        NameCopy    {std::move(Other.NameCopy)},
        TypeNameCopy{std::move(Other.TypeNameCopy)},
        Members     {std::move(Other.Members)}
    // clang-format on
    {
        Name     = NameCopy.c_str();
        TypeName = TypeNameCopy.c_str();
        pMembers = Members.data();
    }